

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>>::
resizeImpl<slang::SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>>::ValueInitTag>
          (SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>> *this,
          size_type newSize,ValueInitTag *val)

{
  ulong uVar1;
  ValueInitTag temp;
  ValueInitTag local_11;
  
  uVar1 = *(ulong *)(this + 8);
  if (newSize >= uVar1) {
    if (newSize < uVar1 || newSize - uVar1 == 0) {
      return;
    }
    if (*(ulong *)(this + 0x10) < newSize) {
      resizeRealloc<slang::SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>>::ValueInitTag>
                (this,newSize,&local_11);
      return;
    }
    std::ranges::__uninitialized_value_construct_n_fn::
    operator()<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_*>
              ((__uninitialized_value_construct_n_fn *)&std::ranges::uninitialized_value_construct_n
               ,(IntervalMap<unsigned_long,_std::monostate,_3U> *)(uVar1 * 0x40 + *(long *)this),
               newSize - uVar1);
  }
  *(size_type *)(this + 8) = newSize;
  return;
}

Assistant:

void resizeImpl(size_type newSize, const TVal& val) {
        if (newSize < len) {
            std::ranges::destroy(begin() + newSize, end());
            len = newSize;
            return;
        }

        if (newSize > len) {
            if (newSize > cap) {
                // Copy the value in case it's inside our existing array.
                TVal temp(val);
                resizeRealloc(newSize, temp);
                return;
            }

            if constexpr (std::is_same_v<T, TVal>) {
                std::ranges::uninitialized_fill_n(end(), ptrdiff_t(newSize - len), val);
            }
            else if constexpr (std::is_same_v<TVal, DefaultInitTag>) {
                std::ranges::uninitialized_default_construct_n(end(), ptrdiff_t(newSize - len));
            }
            else {
                std::ranges::uninitialized_value_construct_n(end(), ptrdiff_t(newSize - len));
            }
            len = newSize;
        }
    }